

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O1

void get_msurf_descriptor_haar_unroll_4_3_False(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  undefined1 auVar6 [32];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float *data;
  int iVar24;
  int iVar25;
  int iVar26;
  uint uVar27;
  ulong uVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  ulong uVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  int c2_1;
  ulong uVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  uint uVar49;
  float *pfVar50;
  long lVar51;
  float *pfVar52;
  float *pfVar53;
  long lVar54;
  long lVar55;
  int iVar56;
  int c2;
  int iVar57;
  int iVar58;
  long lVar59;
  int c2_2;
  int iVar60;
  int iVar61;
  long lVar62;
  int iVar63;
  ulong uVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  float fVar78;
  float fVar79;
  float fVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [16];
  float fVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar96;
  undefined1 auVar97 [16];
  undefined1 auVar99 [12];
  undefined1 auVar98 [64];
  float fVar100;
  undefined1 in_ZMM8 [64];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [64];
  int data_width;
  
  auVar72._8_4_ = 0x80000000;
  auVar72._0_8_ = 0x8000000080000000;
  auVar72._12_4_ = 0x80000000;
  auVar98 = ZEXT1664(auVar72);
  auVar73._8_4_ = 0x3effffff;
  auVar73._0_8_ = 0x3effffff3effffff;
  auVar73._12_4_ = 0x3effffff;
  fVar80 = ipoint->scale;
  auVar103 = ZEXT464((uint)fVar80);
  auVar65 = vpternlogd_avx512vl(auVar73,ZEXT416((uint)fVar80),auVar72,0xf8);
  auVar65 = ZEXT416((uint)(fVar80 + auVar65._0_4_));
  auVar65 = vroundss_avx(auVar65,auVar65,0xb);
  iVar57 = (int)auVar65._0_4_;
  fVar78 = -0.08 / (fVar80 * fVar80);
  auVar66 = vpternlogd_avx512vl(auVar73,ZEXT416((uint)ipoint->x),auVar72,0xf8);
  auVar66 = ZEXT416((uint)(ipoint->x + auVar66._0_4_));
  auVar66 = vroundss_avx(auVar66,auVar66,0xb);
  auVar67._0_8_ = (double)auVar66._0_4_;
  auVar67._8_8_ = auVar66._8_8_;
  auVar71._0_8_ = (double)fVar80;
  auVar71._8_8_ = 0;
  auVar66 = vfmadd231sd_fma(auVar67,auVar71,ZEXT816(0x3fe0000000000000));
  auVar70._0_4_ = (float)auVar66._0_8_;
  auVar70._4_12_ = auVar66._4_12_;
  auVar66 = vpternlogd_avx512vl(auVar73,ZEXT416((uint)ipoint->y),auVar72,0xf8);
  auVar66 = ZEXT416((uint)(ipoint->y + auVar66._0_4_));
  auVar66 = vroundss_avx(auVar66,auVar66,0xb);
  auVar68._0_8_ = (double)auVar66._0_4_;
  auVar68._8_8_ = auVar66._8_8_;
  auVar66 = vfmadd231sd_fma(auVar68,auVar71,ZEXT816(0x3fe0000000000000));
  auVar69._0_4_ = (float)auVar66._0_8_;
  auVar69._4_12_ = auVar66._4_12_;
  auVar66._0_4_ = (int)auVar65._0_4_;
  auVar66._4_4_ = (int)auVar65._4_4_;
  auVar66._8_4_ = (int)auVar65._8_4_;
  auVar66._12_4_ = (int)auVar65._12_4_;
  auVar65 = vcvtdq2ps_avx(auVar66);
  fVar7 = auVar70._0_4_ - auVar65._0_4_;
  fVar8 = auVar69._0_4_ - auVar65._0_4_;
  auVar65 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar80),auVar70);
  auVar66 = vpternlogd_avx512vl(auVar73,auVar65,auVar72,0xf8);
  auVar65 = ZEXT416((uint)(auVar65._0_4_ + auVar66._0_4_));
  auVar65 = vroundss_avx(auVar65,auVar65,0xb);
  auVar66 = ZEXT416((uint)fVar80);
  if (iVar57 < (int)auVar65._0_4_) {
    auVar65 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar66,auVar69);
    auVar74._8_4_ = 0x3effffff;
    auVar74._0_8_ = 0x3effffff3effffff;
    auVar74._12_4_ = 0x3effffff;
    auVar75._8_4_ = 0x80000000;
    auVar75._0_8_ = 0x8000000080000000;
    auVar75._12_4_ = 0x80000000;
    auVar67 = vpternlogd_avx512vl(auVar75,auVar65,auVar74,0xea);
    auVar65 = ZEXT416((uint)(auVar65._0_4_ + auVar67._0_4_));
    auVar65 = vroundss_avx(auVar65,auVar65,0xb);
    if (iVar57 < (int)auVar65._0_4_) {
      auVar65 = vfmadd231ss_fma(auVar70,auVar66,ZEXT416(0x41300000));
      auVar76._8_4_ = 0x80000000;
      auVar76._0_8_ = 0x8000000080000000;
      auVar76._12_4_ = 0x80000000;
      auVar67 = vpternlogd_avx512vl(auVar76,auVar65,auVar74,0xea);
      auVar65 = ZEXT416((uint)(auVar65._0_4_ + auVar67._0_4_));
      auVar65 = vroundss_avx(auVar65,auVar65,0xb);
      if ((int)auVar65._0_4_ + iVar57 <= iimage->width) {
        auVar65 = vfmadd231ss_fma(auVar69,auVar66,ZEXT416(0x41300000));
        auVar18._8_4_ = 0x80000000;
        auVar18._0_8_ = 0x8000000080000000;
        auVar18._12_4_ = 0x80000000;
        auVar67 = vpternlogd_avx512vl(auVar74,auVar65,auVar18,0xf8);
        auVar65 = ZEXT416((uint)(auVar65._0_4_ + auVar67._0_4_));
        auVar65 = vroundss_avx(auVar65,auVar65,0xb);
        if ((int)auVar65._0_4_ + iVar57 <= iimage->height) {
          fVar7 = fVar7 + 0.5;
          fVar8 = fVar8 + 0.5;
          pfVar52 = iimage->data;
          iVar1 = iimage->data_width;
          iVar63 = iVar57 * 2;
          pfVar53 = haarResponseY + 0x4a;
          pfVar50 = haarResponseX + 0x4a;
          uVar27 = 0xfffffff4;
          do {
            auVar65._0_4_ = (float)(int)uVar27;
            auVar99 = in_ZMM8._4_12_;
            auVar65._4_12_ = auVar99;
            auVar65 = vfmadd213ss_fma(auVar65,auVar66,ZEXT416((uint)fVar8));
            iVar30 = (int)auVar65._0_4_;
            auVar88._0_4_ = (float)(int)(uVar27 | 1);
            auVar88._4_12_ = auVar99;
            auVar65 = vfmadd213ss_fma(auVar88,auVar66,ZEXT416((uint)fVar8));
            iVar33 = (int)auVar65._0_4_;
            auVar89._0_4_ = (float)(int)(uVar27 | 2);
            auVar89._4_12_ = auVar99;
            auVar65 = vfmadd213ss_fma(auVar89,auVar66,ZEXT416((uint)fVar8));
            iVar29 = (int)auVar65._0_4_;
            auVar90._0_4_ = (float)(int)(uVar27 | 3);
            auVar90._4_12_ = auVar99;
            auVar65 = vfmadd213ss_fma(auVar90,auVar66,ZEXT416((uint)fVar8));
            iVar34 = (int)auVar65._0_4_;
            iVar39 = (iVar30 + -1) * iVar1;
            iVar31 = (iVar30 + -1 + iVar57) * iVar1;
            iVar36 = (iVar30 + -1 + iVar63) * iVar1;
            iVar40 = (iVar33 + -1) * iVar1;
            iVar32 = (iVar33 + -1 + iVar57) * iVar1;
            iVar37 = (iVar33 + -1 + iVar63) * iVar1;
            iVar30 = (iVar29 + -1) * iVar1;
            iVar33 = (iVar29 + -1 + iVar57) * iVar1;
            iVar38 = (iVar29 + -1 + iVar63) * iVar1;
            iVar35 = (iVar34 + -1) * iVar1;
            iVar29 = (iVar34 + -1 + iVar57) * iVar1;
            iVar34 = (iVar34 + -1 + iVar63) * iVar1;
            lVar43 = 0;
            do {
              iVar58 = (int)lVar43;
              auVar91._0_4_ = (float)(iVar58 + -0xc);
              auVar99 = auVar73._4_12_;
              auVar91._4_12_ = auVar99;
              auVar65 = vfmadd213ss_fma(auVar91,auVar66,ZEXT416((uint)fVar7));
              iVar25 = (int)auVar65._0_4_;
              auVar92._0_4_ = (float)(iVar58 + -0xb);
              auVar92._4_12_ = auVar99;
              auVar65 = vfmadd213ss_fma(auVar92,auVar66,ZEXT416((uint)fVar7));
              iVar60 = (int)auVar65._0_4_;
              auVar93._0_4_ = (float)(iVar58 + -10);
              auVar93._4_12_ = auVar99;
              auVar65 = vfmadd213ss_fma(auVar93,auVar66,ZEXT416((uint)fVar7));
              iVar24 = (int)auVar65._0_4_;
              iVar26 = iVar25 + -1 + iVar57;
              iVar56 = iVar25 + -1 + iVar63;
              fVar80 = pfVar52[iVar31 + -1 + iVar25];
              fVar79 = pfVar52[iVar36 + -1 + iVar25];
              fVar96 = pfVar52[iVar36 + iVar56];
              fVar9 = pfVar52[iVar39 + -1 + iVar25];
              fVar10 = pfVar52[iVar39 + iVar56];
              auVar67 = SUB6416(ZEXT464(0x40000000),0);
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar39 + iVar26] -
                                                      pfVar52[iVar36 + iVar26])),auVar67,
                                        ZEXT416((uint)(fVar96 - fVar9)));
              fVar85 = pfVar52[iVar31 + iVar56];
              pfVar50[lVar43 + -0x4a] = (fVar79 - fVar10) + auVar65._0_4_;
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(fVar80 - fVar85)),auVar67,
                                        ZEXT416((uint)(fVar96 - fVar9)));
              iVar47 = iVar60 + -1 + iVar57;
              pfVar53[lVar43 + -0x4a] = auVar65._0_4_ - (fVar79 - fVar10);
              iVar48 = iVar60 + -1 + iVar63;
              fVar80 = pfVar52[iVar31 + -1 + iVar60];
              fVar79 = pfVar52[iVar36 + -1 + iVar60];
              fVar96 = pfVar52[iVar36 + iVar48];
              fVar9 = pfVar52[iVar39 + -1 + iVar60];
              fVar10 = pfVar52[iVar39 + iVar48];
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar39 + iVar47] -
                                                      pfVar52[iVar36 + iVar47])),auVar67,
                                        ZEXT416((uint)(fVar96 - fVar9)));
              fVar85 = pfVar52[iVar31 + iVar48];
              pfVar50[lVar43 + -0x49] = (fVar79 - fVar10) + auVar65._0_4_;
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(fVar80 - fVar85)),auVar67,
                                        ZEXT416((uint)(fVar96 - fVar9)));
              pfVar53[lVar43 + -0x49] = auVar65._0_4_ - (fVar79 - fVar10);
              iVar46 = iVar24 + -1 + iVar57;
              iVar61 = iVar24 + -1 + iVar63;
              fVar80 = pfVar52[iVar31 + -1 + iVar24];
              fVar79 = pfVar52[iVar36 + -1 + iVar24];
              fVar96 = pfVar52[iVar36 + iVar61];
              fVar9 = pfVar52[iVar39 + -1 + iVar24];
              fVar10 = pfVar52[iVar39 + iVar61];
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar39 + iVar46] -
                                                      pfVar52[iVar36 + iVar46])),auVar67,
                                        ZEXT416((uint)(fVar96 - fVar9)));
              fVar85 = pfVar52[iVar31 + iVar61];
              pfVar50[lVar43 + -0x48] = (fVar79 - fVar10) + auVar65._0_4_;
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(fVar80 - fVar85)),auVar67,
                                        ZEXT416((uint)(fVar96 - fVar9)));
              pfVar53[lVar43 + -0x48] = auVar65._0_4_ - (fVar79 - fVar10);
              fVar80 = pfVar52[iVar32 + -1 + iVar25];
              fVar79 = pfVar52[iVar37 + -1 + iVar25];
              fVar96 = pfVar52[iVar37 + iVar56];
              fVar9 = pfVar52[iVar40 + -1 + iVar25];
              fVar10 = pfVar52[iVar40 + iVar56];
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar40 + iVar26] -
                                                      pfVar52[iVar37 + iVar26])),auVar67,
                                        ZEXT416((uint)(fVar96 - fVar9)));
              fVar85 = pfVar52[iVar32 + iVar56];
              pfVar50[lVar43 + -0x32] = (fVar79 - fVar10) + auVar65._0_4_;
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(fVar80 - fVar85)),auVar67,
                                        ZEXT416((uint)(fVar96 - fVar9)));
              pfVar53[lVar43 + -0x32] = auVar65._0_4_ - (fVar79 - fVar10);
              fVar80 = pfVar52[iVar32 + -1 + iVar60];
              fVar79 = pfVar52[iVar37 + -1 + iVar60];
              fVar96 = pfVar52[iVar37 + iVar48];
              fVar9 = pfVar52[iVar40 + -1 + iVar60];
              fVar10 = pfVar52[iVar40 + iVar48];
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar40 + iVar47] -
                                                      pfVar52[iVar37 + iVar47])),auVar67,
                                        ZEXT416((uint)(fVar96 - fVar9)));
              fVar85 = pfVar52[iVar32 + iVar48];
              pfVar50[lVar43 + -0x31] = (fVar79 - fVar10) + auVar65._0_4_;
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(fVar80 - fVar85)),auVar67,
                                        ZEXT416((uint)(fVar96 - fVar9)));
              pfVar53[lVar43 + -0x31] = auVar65._0_4_ - (fVar79 - fVar10);
              fVar80 = pfVar52[iVar32 + -1 + iVar24];
              fVar79 = pfVar52[iVar37 + -1 + iVar24];
              fVar96 = pfVar52[iVar37 + iVar61];
              fVar9 = pfVar52[iVar40 + -1 + iVar24];
              fVar10 = pfVar52[iVar40 + iVar61];
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar40 + iVar46] -
                                                      pfVar52[iVar37 + iVar46])),auVar67,
                                        ZEXT416((uint)(fVar96 - fVar9)));
              fVar85 = pfVar52[iVar32 + iVar61];
              pfVar50[lVar43 + -0x30] = (fVar79 - fVar10) + auVar65._0_4_;
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(fVar80 - fVar85)),auVar67,
                                        ZEXT416((uint)(fVar96 - fVar9)));
              pfVar53[lVar43 + -0x30] = auVar65._0_4_ - (fVar79 - fVar10);
              fVar80 = pfVar52[iVar33 + -1 + iVar25];
              fVar79 = pfVar52[iVar38 + -1 + iVar25];
              fVar96 = pfVar52[iVar38 + iVar56];
              fVar9 = pfVar52[iVar30 + -1 + iVar25];
              fVar10 = pfVar52[iVar30 + iVar56];
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar30 + iVar26] -
                                                      pfVar52[iVar38 + iVar26])),auVar67,
                                        ZEXT416((uint)(fVar96 - fVar9)));
              fVar85 = pfVar52[iVar33 + iVar56];
              pfVar50[lVar43 + -0x1a] = (fVar79 - fVar10) + auVar65._0_4_;
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(fVar80 - fVar85)),auVar67,
                                        ZEXT416((uint)(fVar96 - fVar9)));
              pfVar53[lVar43 + -0x1a] = auVar65._0_4_ - (fVar79 - fVar10);
              fVar80 = pfVar52[iVar33 + -1 + iVar60];
              fVar79 = pfVar52[iVar38 + -1 + iVar60];
              fVar96 = pfVar52[iVar38 + iVar48];
              fVar9 = pfVar52[iVar30 + -1 + iVar60];
              fVar10 = pfVar52[iVar30 + iVar48];
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar30 + iVar47] -
                                                      pfVar52[iVar38 + iVar47])),auVar67,
                                        ZEXT416((uint)(fVar96 - fVar9)));
              fVar85 = pfVar52[iVar33 + iVar48];
              pfVar50[lVar43 + -0x19] = (fVar79 - fVar10) + auVar65._0_4_;
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(fVar80 - fVar85)),auVar67,
                                        ZEXT416((uint)(fVar96 - fVar9)));
              pfVar53[lVar43 + -0x19] = auVar65._0_4_ - (fVar79 - fVar10);
              fVar80 = pfVar52[iVar33 + -1 + iVar24];
              fVar79 = pfVar52[iVar38 + -1 + iVar24];
              fVar96 = pfVar52[iVar38 + iVar61];
              fVar9 = pfVar52[iVar30 + -1 + iVar24];
              fVar10 = pfVar52[iVar30 + iVar61];
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar30 + iVar46] -
                                                      pfVar52[iVar38 + iVar46])),auVar67,
                                        ZEXT416((uint)(fVar96 - fVar9)));
              fVar85 = pfVar52[iVar33 + iVar61];
              pfVar50[lVar43 + -0x18] = (fVar79 - fVar10) + auVar65._0_4_;
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(fVar80 - fVar85)),auVar67,
                                        ZEXT416((uint)(fVar96 - fVar9)));
              pfVar53[lVar43 + -0x18] = auVar65._0_4_ - (fVar79 - fVar10);
              fVar80 = pfVar52[iVar29 + -1 + iVar25];
              fVar79 = pfVar52[iVar34 + -1 + iVar25];
              fVar96 = pfVar52[iVar56 + iVar34];
              fVar9 = pfVar52[iVar35 + -1 + iVar25];
              fVar10 = pfVar52[iVar35 + iVar56];
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar35 + iVar26] -
                                                      pfVar52[iVar26 + iVar34])),auVar67,
                                        ZEXT416((uint)(fVar96 - fVar9)));
              fVar85 = pfVar52[iVar29 + iVar56];
              pfVar50[lVar43 + -2] = (fVar79 - fVar10) + auVar65._0_4_;
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(fVar80 - fVar85)),auVar67,
                                        ZEXT416((uint)(fVar96 - fVar9)));
              pfVar53[lVar43 + -2] = auVar65._0_4_ - (fVar79 - fVar10);
              fVar80 = pfVar52[iVar29 + -1 + iVar60];
              fVar79 = pfVar52[iVar34 + -1 + iVar60];
              fVar96 = pfVar52[iVar48 + iVar34];
              fVar9 = pfVar52[iVar35 + -1 + iVar60];
              fVar10 = pfVar52[iVar35 + iVar48];
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar35 + iVar47] -
                                                      pfVar52[iVar47 + iVar34])),auVar67,
                                        ZEXT416((uint)(fVar96 - fVar9)));
              fVar85 = pfVar52[iVar29 + iVar48];
              pfVar50[lVar43 + -1] = (fVar79 - fVar10) + auVar65._0_4_;
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(fVar80 - fVar85)),auVar67,
                                        ZEXT416((uint)(fVar96 - fVar9)));
              pfVar53[lVar43 + -1] = auVar65._0_4_ - (fVar79 - fVar10);
              fVar80 = pfVar52[iVar29 + -1 + iVar24];
              fVar79 = pfVar52[iVar34 + -1 + iVar24];
              fVar96 = pfVar52[iVar61 + iVar34];
              fVar9 = pfVar52[iVar35 + -1 + iVar24];
              fVar10 = pfVar52[iVar35 + iVar61];
              fVar85 = pfVar52[iVar29 + iVar61];
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar52[iVar35 + iVar46] -
                                                      pfVar52[iVar46 + iVar34])),auVar67,
                                        ZEXT416((uint)(fVar96 - fVar9)));
              pfVar50[lVar43] = (fVar79 - fVar10) + auVar65._0_4_;
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(fVar80 - fVar85)),auVar67,
                                        ZEXT416((uint)(fVar96 - fVar9)));
              pfVar53[lVar43] = auVar65._0_4_ - (fVar79 - fVar10);
              lVar43 = lVar43 + 3;
            } while (iVar58 + -0xc < 9);
            pfVar53 = pfVar53 + 0x60;
            pfVar50 = pfVar50 + 0x60;
            bVar2 = (int)uVar27 < 8;
            uVar27 = uVar27 + 4;
          } while (bVar2);
          goto LAB_0021db7f;
        }
      }
    }
  }
  iVar1 = iVar57 * 2;
  lVar43 = 0;
  uVar27 = 0xfffffff4;
  do {
    auVar65 = vpbroadcastd_avx512vl();
    auVar19._8_4_ = 3;
    auVar19._0_8_ = 0x200000003;
    auVar19._12_4_ = 2;
    auVar65 = vporq_avx512vl(auVar65,auVar19);
    auVar65 = vpinsrd_avx(auVar65,uVar27 | 1,2);
    auVar65 = vpinsrd_avx(auVar65,uVar27,3);
    auVar65 = vcvtdq2ps_avx(auVar65);
    auVar22._4_4_ = fVar8;
    auVar22._0_4_ = fVar8;
    auVar22._8_4_ = fVar8;
    auVar22._12_4_ = fVar8;
    auVar23._4_4_ = fVar80;
    auVar23._0_4_ = fVar80;
    auVar23._8_4_ = fVar80;
    auVar23._12_4_ = fVar80;
    auVar65 = vfmadd132ps_fma(auVar65,auVar22,auVar23);
    auVar6 = vcvtps2pd_avx(auVar65);
    uVar28 = vcmpps_avx512vl(auVar65,_DAT_00576190,0xd);
    auVar83._8_8_ = 0xbfe0000000000000;
    auVar83._0_8_ = 0xbfe0000000000000;
    auVar83._16_8_ = 0xbfe0000000000000;
    auVar83._24_8_ = 0xbfe0000000000000;
    auVar77._12_4_ = 0x3fe00000;
    auVar77._0_12_ = ZEXT812(0x3fe0000000000000);
    auVar77._16_8_ = 0x3fe0000000000000;
    auVar77._24_8_ = 0x3fe0000000000000;
    auVar77 = vblendmpd_avx512vl(auVar83,auVar77);
    bVar2 = (bool)((byte)uVar28 & 1);
    bVar3 = (bool)((byte)(uVar28 >> 1) & 1);
    bVar4 = (bool)((byte)(uVar28 >> 2) & 1);
    bVar5 = (bool)((byte)(uVar28 >> 3) & 1);
    auVar81._0_4_ =
         (int)((double)((ulong)bVar2 * auVar77._0_8_ | (ulong)!bVar2 * -0x4020000000000000) +
              auVar6._0_8_);
    auVar81._4_4_ =
         (int)((double)((ulong)bVar3 * auVar77._8_8_ | (ulong)!bVar3 * -0x4020000000000000) +
              auVar6._8_8_);
    auVar81._8_4_ =
         (int)((double)((ulong)bVar4 * auVar77._16_8_ | (ulong)!bVar4 * -0x4020000000000000) +
              auVar6._16_8_);
    auVar81._12_4_ =
         (int)((double)((ulong)bVar5 * auVar77._24_8_ | (ulong)!bVar5 * -0x4020000000000000) +
              auVar6._24_8_);
    iVar29 = iVar1 + auVar81._12_4_;
    iVar30 = auVar81._12_4_ + -1 + iVar57;
    iVar31 = auVar81._12_4_ + -1;
    iVar32 = iVar1 + auVar81._8_4_;
    iVar33 = auVar81._8_4_ + -1 + iVar57;
    iVar34 = auVar81._8_4_ + -1;
    auVar20._8_4_ = 1;
    auVar20._0_8_ = 0x100000001;
    auVar20._12_4_ = 1;
    uVar28 = vpcmpd_avx512vl(auVar81,auVar20,1);
    uVar64 = uVar28 & 0xf;
    uVar45 = uVar64 >> 1;
    uVar41 = uVar64 >> 2;
    uVar64 = uVar64 >> 3;
    iVar35 = iVar1 + auVar81._4_4_;
    iVar36 = auVar81._4_4_ + -1 + iVar57;
    iVar37 = auVar81._4_4_ + -1;
    iVar38 = iVar1 + auVar81._0_4_;
    iVar39 = auVar81._0_4_ + -1 + iVar57;
    iVar40 = auVar81._0_4_ + -1;
    lVar42 = lVar43;
    iVar63 = -0xc;
    do {
      auVar82._0_4_ = (float)iVar63;
      auVar99 = auVar98._4_12_;
      auVar82._4_12_ = auVar99;
      auVar68 = auVar103._0_16_;
      auVar65 = vfmadd213ss_fma(auVar82,auVar68,ZEXT416((uint)fVar7));
      auVar97._0_4_ = (float)(iVar63 + 1);
      auVar97._4_12_ = auVar99;
      auVar67 = vfmadd213ss_fma(auVar97,auVar68,ZEXT416((uint)fVar7));
      auVar94._0_4_ = (float)(iVar63 + 2);
      auVar94._4_12_ = auVar99;
      auVar68 = vfmadd213ss_fma(auVar94,auVar68,ZEXT416((uint)fVar7));
      fVar79 = auVar65._0_4_;
      iVar58 = (int)((double)((ulong)(0.0 <= fVar79) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar79) * -0x4020000000000000) + (double)fVar79);
      fVar96 = auVar67._0_4_;
      fVar79 = auVar68._0_4_;
      pfVar52 = (float *)((long)haarResponseY + lVar42);
      if (((iVar58 < 1 || uVar64 != 0) || (iimage->height < iVar29)) ||
         (iVar24 = iVar1 + iVar58, iimage->width < iVar24)) {
        auVar98 = ZEXT1664(auVar98._0_16_);
        haarXY(iimage,auVar81._12_4_,iVar58,iVar57,(float *)((long)haarResponseX + lVar42),pfVar52);
      }
      else {
        iVar46 = iVar58 + -1 + iVar57;
        pfVar53 = iimage->data;
        iVar25 = iimage->data_width;
        iVar26 = iVar25 * iVar31;
        fVar9 = pfVar53[iVar25 * iVar30 + -1 + iVar58];
        iVar48 = iVar25 * (iVar1 + -1 + auVar81._12_4_);
        fVar10 = pfVar53[iVar48 + -1 + iVar58];
        fVar85 = pfVar53[iVar48 + -1 + iVar24];
        fVar11 = pfVar53[iVar26 + -1 + iVar58];
        fVar12 = pfVar53[iVar26 + -1 + iVar24];
        fVar13 = pfVar53[iVar25 * iVar30 + -1 + iVar24];
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar26 + iVar46] - pfVar53[iVar48 + iVar46]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar85 - fVar11)));
        *(float *)((long)haarResponseX + lVar42) = (fVar10 - fVar12) + auVar65._0_4_;
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(fVar9 - fVar13)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar85 - fVar11)));
        *pfVar52 = auVar65._0_4_ - (fVar10 - fVar12);
      }
      iVar24 = (int)((double)((ulong)(0.0 <= fVar96) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar96) * -0x4020000000000000) + (double)fVar96);
      pfVar52 = (float *)((long)haarResponseX + lVar42 + 4);
      pfVar53 = (float *)((long)haarResponseY + lVar42 + 4);
      if (((iVar24 < 1 || uVar64 != 0) || (iimage->height < iVar29)) ||
         (iVar25 = iVar1 + iVar24, iimage->width < iVar25)) {
        auVar98 = ZEXT1664(auVar98._0_16_);
        haarXY(iimage,auVar81._12_4_,iVar24,iVar57,pfVar52,pfVar53);
      }
      else {
        iVar48 = iVar24 + -1 + iVar57;
        pfVar50 = iimage->data;
        iVar26 = iimage->data_width;
        iVar46 = iVar26 * iVar31;
        fVar96 = pfVar50[iVar26 * iVar30 + -1 + iVar24];
        iVar47 = iVar26 * (iVar1 + -1 + auVar81._12_4_);
        fVar9 = pfVar50[iVar47 + -1 + iVar24];
        fVar10 = pfVar50[iVar47 + -1 + iVar25];
        fVar85 = pfVar50[iVar46 + -1 + iVar24];
        fVar11 = pfVar50[iVar46 + -1 + iVar25];
        fVar12 = pfVar50[iVar26 * iVar30 + -1 + iVar25];
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar50[iVar46 + iVar48] - pfVar50[iVar47 + iVar48]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar85)));
        *pfVar52 = (fVar9 - fVar11) + auVar65._0_4_;
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(fVar96 - fVar12)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar85)));
        *pfVar53 = auVar65._0_4_ - (fVar9 - fVar11);
      }
      iVar25 = (int)((double)((ulong)(0.0 <= fVar79) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar79) * -0x4020000000000000) + (double)fVar79);
      pfVar52 = (float *)((long)haarResponseX + lVar42 + 8);
      pfVar53 = (float *)((long)haarResponseY + lVar42 + 8);
      if (((iVar25 < 1 || uVar64 != 0) || (iimage->height < iVar29)) ||
         (iVar26 = iVar1 + iVar25, iimage->width < iVar26)) {
        auVar98 = ZEXT1664(auVar98._0_16_);
        haarXY(iimage,auVar81._12_4_,iVar25,iVar57,pfVar52,pfVar53);
      }
      else {
        iVar47 = iVar25 + -1 + iVar57;
        pfVar50 = iimage->data;
        iVar46 = iimage->data_width;
        iVar48 = iVar46 * iVar31;
        fVar79 = pfVar50[iVar46 * iVar30 + -1 + iVar25];
        iVar56 = iVar46 * (iVar1 + -1 + auVar81._12_4_);
        fVar96 = pfVar50[iVar56 + -1 + iVar25];
        fVar9 = pfVar50[iVar56 + -1 + iVar26];
        fVar10 = pfVar50[iVar48 + -1 + iVar25];
        fVar85 = pfVar50[iVar48 + -1 + iVar26];
        fVar11 = pfVar50[iVar46 * iVar30 + -1 + iVar26];
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar50[iVar48 + iVar47] - pfVar50[iVar56 + iVar47]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar52 = (fVar96 - fVar85) + auVar65._0_4_;
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(fVar79 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar53 = auVar65._0_4_ - (fVar96 - fVar85);
      }
      pfVar52 = (float *)((long)haarResponseX + lVar42 + 0x60);
      pfVar53 = (float *)((long)haarResponseY + lVar42 + 0x60);
      if (((iVar58 < 1 || (uVar41 & 1) != 0) || (iimage->height < iVar32)) ||
         (iVar26 = iVar1 + iVar58, iimage->width < iVar26)) {
        auVar98 = ZEXT1664(auVar98._0_16_);
        haarXY(iimage,auVar81._8_4_,iVar58,iVar57,pfVar52,pfVar53);
      }
      else {
        iVar47 = iVar58 + -1 + iVar57;
        pfVar50 = iimage->data;
        iVar46 = iimage->data_width;
        iVar48 = iVar46 * iVar34;
        fVar79 = pfVar50[iVar46 * iVar33 + -1 + iVar58];
        iVar56 = iVar46 * (iVar1 + -1 + auVar81._8_4_);
        fVar96 = pfVar50[iVar56 + -1 + iVar58];
        fVar9 = pfVar50[iVar56 + -1 + iVar26];
        fVar10 = pfVar50[iVar48 + -1 + iVar58];
        fVar85 = pfVar50[iVar48 + -1 + iVar26];
        fVar11 = pfVar50[iVar46 * iVar33 + -1 + iVar26];
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar50[iVar48 + iVar47] - pfVar50[iVar56 + iVar47]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar52 = (fVar96 - fVar85) + auVar65._0_4_;
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(fVar79 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar53 = auVar65._0_4_ - (fVar96 - fVar85);
      }
      pfVar52 = (float *)((long)haarResponseX + lVar42 + 100);
      pfVar53 = (float *)((long)haarResponseY + lVar42 + 100);
      if (((iVar24 < 1 || (uVar41 & 1) != 0) || (iimage->height < iVar32)) ||
         (iVar26 = iVar1 + iVar24, iimage->width < iVar26)) {
        auVar98 = ZEXT1664(auVar98._0_16_);
        haarXY(iimage,auVar81._8_4_,iVar24,iVar57,pfVar52,pfVar53);
      }
      else {
        iVar47 = iVar24 + -1 + iVar57;
        pfVar50 = iimage->data;
        iVar46 = iimage->data_width;
        iVar48 = iVar46 * iVar34;
        fVar79 = pfVar50[iVar46 * iVar33 + -1 + iVar24];
        iVar56 = iVar46 * (iVar1 + -1 + auVar81._8_4_);
        fVar96 = pfVar50[iVar56 + -1 + iVar24];
        fVar9 = pfVar50[iVar56 + -1 + iVar26];
        fVar10 = pfVar50[iVar48 + -1 + iVar24];
        fVar85 = pfVar50[iVar48 + -1 + iVar26];
        fVar11 = pfVar50[iVar46 * iVar33 + -1 + iVar26];
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar50[iVar48 + iVar47] - pfVar50[iVar56 + iVar47]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar52 = (fVar96 - fVar85) + auVar65._0_4_;
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(fVar79 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar53 = auVar65._0_4_ - (fVar96 - fVar85);
      }
      pfVar52 = (float *)((long)haarResponseX + lVar42 + 0x68);
      pfVar53 = (float *)((long)haarResponseY + lVar42 + 0x68);
      if (((iVar25 < 1 || (uVar41 & 1) != 0) || (iimage->height < iVar32)) ||
         (iVar26 = iVar1 + iVar25, iimage->width < iVar26)) {
        auVar98 = ZEXT1664(auVar98._0_16_);
        haarXY(iimage,auVar81._8_4_,iVar25,iVar57,pfVar52,pfVar53);
      }
      else {
        iVar47 = iVar25 + -1 + iVar57;
        pfVar50 = iimage->data;
        iVar46 = iimage->data_width;
        iVar48 = iVar46 * iVar34;
        fVar79 = pfVar50[iVar46 * iVar33 + -1 + iVar25];
        iVar56 = iVar46 * (iVar1 + -1 + auVar81._8_4_);
        fVar96 = pfVar50[iVar56 + -1 + iVar25];
        fVar9 = pfVar50[iVar56 + -1 + iVar26];
        fVar10 = pfVar50[iVar48 + -1 + iVar25];
        fVar85 = pfVar50[iVar48 + -1 + iVar26];
        fVar11 = pfVar50[iVar46 * iVar33 + -1 + iVar26];
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar50[iVar48 + iVar47] - pfVar50[iVar56 + iVar47]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar52 = (fVar96 - fVar85) + auVar65._0_4_;
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(fVar79 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar53 = auVar65._0_4_ - (fVar96 - fVar85);
      }
      pfVar52 = (float *)((long)haarResponseX + lVar42 + 0xc0);
      pfVar53 = (float *)((long)haarResponseY + lVar42 + 0xc0);
      if (((iVar58 < 1 || (uVar45 & 1) != 0) || (iimage->height < iVar35)) ||
         (iVar26 = iVar1 + iVar58, iimage->width < iVar26)) {
        auVar98 = ZEXT1664(auVar98._0_16_);
        haarXY(iimage,auVar81._4_4_,iVar58,iVar57,pfVar52,pfVar53);
      }
      else {
        iVar47 = iVar58 + -1 + iVar57;
        pfVar50 = iimage->data;
        iVar46 = iimage->data_width;
        iVar48 = iVar46 * iVar37;
        fVar79 = pfVar50[iVar46 * iVar36 + -1 + iVar58];
        iVar56 = iVar46 * (iVar1 + -1 + auVar81._4_4_);
        fVar96 = pfVar50[iVar56 + -1 + iVar58];
        fVar9 = pfVar50[iVar56 + -1 + iVar26];
        fVar10 = pfVar50[iVar48 + -1 + iVar58];
        fVar85 = pfVar50[iVar48 + -1 + iVar26];
        fVar11 = pfVar50[iVar46 * iVar36 + -1 + iVar26];
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar50[iVar48 + iVar47] - pfVar50[iVar56 + iVar47]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar52 = (fVar96 - fVar85) + auVar65._0_4_;
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(fVar79 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar53 = auVar65._0_4_ - (fVar96 - fVar85);
      }
      pfVar52 = (float *)((long)haarResponseX + lVar42 + 0xc4);
      pfVar53 = (float *)((long)haarResponseY + lVar42 + 0xc4);
      if (((iVar24 < 1 || (uVar45 & 1) != 0) || (iimage->height < iVar35)) ||
         (iVar26 = iVar1 + iVar24, iimage->width < iVar26)) {
        auVar98 = ZEXT1664(auVar98._0_16_);
        haarXY(iimage,auVar81._4_4_,iVar24,iVar57,pfVar52,pfVar53);
      }
      else {
        iVar47 = iVar24 + -1 + iVar57;
        pfVar50 = iimage->data;
        iVar46 = iimage->data_width;
        iVar48 = iVar46 * iVar37;
        fVar79 = pfVar50[iVar46 * iVar36 + -1 + iVar24];
        iVar56 = iVar46 * (iVar1 + -1 + auVar81._4_4_);
        fVar96 = pfVar50[iVar56 + -1 + iVar24];
        fVar9 = pfVar50[iVar56 + -1 + iVar26];
        fVar10 = pfVar50[iVar48 + -1 + iVar24];
        fVar85 = pfVar50[iVar48 + -1 + iVar26];
        fVar11 = pfVar50[iVar46 * iVar36 + -1 + iVar26];
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar50[iVar48 + iVar47] - pfVar50[iVar56 + iVar47]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar52 = (fVar96 - fVar85) + auVar65._0_4_;
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(fVar79 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar53 = auVar65._0_4_ - (fVar96 - fVar85);
      }
      pfVar52 = (float *)((long)haarResponseX + lVar42 + 200);
      pfVar53 = (float *)((long)haarResponseY + lVar42 + 200);
      if (((iVar25 < 1 || (uVar45 & 1) != 0) || (iimage->height < iVar35)) ||
         (iVar26 = iVar1 + iVar25, iimage->width < iVar26)) {
        auVar98 = ZEXT1664(auVar98._0_16_);
        haarXY(iimage,auVar81._4_4_,iVar25,iVar57,pfVar52,pfVar53);
      }
      else {
        iVar47 = iVar25 + -1 + iVar57;
        pfVar50 = iimage->data;
        iVar46 = iimage->data_width;
        iVar48 = iVar46 * iVar37;
        fVar79 = pfVar50[iVar46 * iVar36 + -1 + iVar25];
        iVar56 = iVar46 * (iVar1 + -1 + auVar81._4_4_);
        fVar96 = pfVar50[iVar56 + -1 + iVar25];
        fVar9 = pfVar50[iVar56 + -1 + iVar26];
        fVar10 = pfVar50[iVar48 + -1 + iVar25];
        fVar85 = pfVar50[iVar48 + -1 + iVar26];
        fVar11 = pfVar50[iVar46 * iVar36 + -1 + iVar26];
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar50[iVar48 + iVar47] - pfVar50[iVar56 + iVar47]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar52 = (fVar96 - fVar85) + auVar65._0_4_;
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(fVar79 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar53 = auVar65._0_4_ - (fVar96 - fVar85);
      }
      pfVar52 = (float *)((long)haarResponseX + lVar42 + 0x120);
      pfVar53 = (float *)((long)haarResponseY + lVar42 + 0x120);
      if (((iVar58 < 1 || (uVar28 & 1) != 0) || (iimage->height < iVar38)) ||
         (iVar26 = iVar1 + iVar58, iimage->width < iVar26)) {
        auVar98 = ZEXT1664(auVar98._0_16_);
        haarXY(iimage,auVar81._0_4_,iVar58,iVar57,pfVar52,pfVar53);
      }
      else {
        iVar56 = iVar58 + -1 + iVar57;
        pfVar50 = iimage->data;
        iVar46 = iimage->data_width;
        iVar47 = iVar46 * iVar40;
        fVar79 = pfVar50[iVar46 * iVar39 + -1 + iVar58];
        iVar48 = iVar46 * (iVar1 + -1 + auVar81._0_4_);
        fVar96 = pfVar50[iVar48 + -1 + iVar58];
        fVar9 = pfVar50[iVar48 + -1 + iVar26];
        fVar10 = pfVar50[iVar47 + -1 + iVar58];
        fVar85 = pfVar50[iVar47 + -1 + iVar26];
        fVar11 = pfVar50[iVar46 * iVar39 + -1 + iVar26];
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar50[iVar47 + iVar56] - pfVar50[iVar48 + iVar56]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar52 = (fVar96 - fVar85) + auVar65._0_4_;
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(fVar79 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar53 = auVar65._0_4_ - (fVar96 - fVar85);
      }
      pfVar52 = (float *)((long)haarResponseX + lVar42 + 0x124);
      pfVar53 = (float *)((long)haarResponseY + lVar42 + 0x124);
      if (((iVar24 < 1 || (uVar28 & 1) != 0) || (iimage->height < iVar38)) ||
         (iVar58 = iVar1 + iVar24, iimage->width < iVar58)) {
        auVar98 = ZEXT1664(auVar98._0_16_);
        haarXY(iimage,auVar81._0_4_,iVar24,iVar57,pfVar52,pfVar53);
      }
      else {
        iVar46 = iVar24 + -1 + iVar57;
        pfVar50 = iimage->data;
        iVar26 = iimage->data_width;
        iVar47 = iVar26 * iVar40;
        fVar79 = pfVar50[iVar26 * iVar39 + -1 + iVar24];
        iVar48 = iVar26 * (iVar1 + -1 + auVar81._0_4_);
        fVar96 = pfVar50[iVar48 + -1 + iVar24];
        fVar9 = pfVar50[iVar48 + -1 + iVar58];
        fVar10 = pfVar50[iVar47 + -1 + iVar24];
        fVar85 = pfVar50[iVar47 + -1 + iVar58];
        fVar11 = pfVar50[iVar26 * iVar39 + -1 + iVar58];
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar50[iVar47 + iVar46] - pfVar50[iVar48 + iVar46]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar52 = (fVar96 - fVar85) + auVar65._0_4_;
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(fVar79 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar53 = auVar65._0_4_ - (fVar96 - fVar85);
      }
      pfVar52 = (float *)((long)haarResponseX + lVar42 + 0x128);
      pfVar53 = (float *)((long)haarResponseY + lVar42 + 0x128);
      if (((iVar25 < 1 || (uVar28 & 1) != 0) || (iimage->height < iVar38)) ||
         (iVar58 = iVar1 + iVar25, iimage->width < iVar58)) {
        auVar98 = ZEXT1664(auVar98._0_16_);
        haarXY(iimage,auVar81._0_4_,iVar25,iVar57,pfVar52,pfVar53);
      }
      else {
        iVar26 = iVar25 + -1 + iVar57;
        pfVar50 = iimage->data;
        iVar24 = iimage->data_width;
        iVar48 = iVar24 * iVar40;
        fVar79 = pfVar50[iVar24 * iVar39 + -1 + iVar25];
        iVar46 = iVar24 * (iVar1 + -1 + auVar81._0_4_);
        fVar96 = pfVar50[iVar46 + -1 + iVar25];
        fVar9 = pfVar50[iVar46 + -1 + iVar58];
        fVar10 = pfVar50[iVar48 + -1 + iVar25];
        fVar85 = pfVar50[iVar48 + -1 + iVar58];
        fVar11 = pfVar50[iVar24 * iVar39 + -1 + iVar58];
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar50[iVar48 + iVar26] - pfVar50[iVar46 + iVar26]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar52 = (fVar96 - fVar85) + auVar65._0_4_;
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(fVar79 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar53 = auVar65._0_4_ - (fVar96 - fVar85);
      }
      auVar103 = ZEXT1664(auVar66);
      lVar42 = lVar42 + 0xc;
      bVar2 = iVar63 < 9;
      iVar63 = iVar63 + 3;
    } while (bVar2);
    lVar43 = lVar43 + 0x180;
    bVar2 = (int)uVar27 < 8;
    uVar27 = uVar27 + 4;
  } while (bVar2);
LAB_0021db7f:
  fVar80 = auVar103._0_4_;
  auVar102._8_4_ = 0x3effffff;
  auVar102._0_8_ = 0x3effffff3effffff;
  auVar102._12_4_ = 0x3effffff;
  auVar101._8_4_ = 0x80000000;
  auVar101._0_8_ = 0x8000000080000000;
  auVar101._12_4_ = 0x80000000;
  auVar65 = vpternlogd_avx512vl(auVar102,ZEXT416((uint)(fVar80 * 0.5)),auVar101,0xf8);
  auVar65 = ZEXT416((uint)(fVar80 * 0.5 + auVar65._0_4_));
  auVar65 = vroundss_avx(auVar65,auVar65,0xb);
  auVar66 = vpternlogd_avx512vl(auVar102,ZEXT416((uint)(fVar80 * 1.5)),auVar101,0xf8);
  auVar66 = ZEXT416((uint)(fVar80 * 1.5 + auVar66._0_4_));
  auVar66 = vroundss_avx(auVar66,auVar66,0xb);
  auVar67 = vpternlogd_avx512vl(auVar102,ZEXT416((uint)(fVar80 * 2.5)),auVar101,0xf8);
  auVar67 = ZEXT416((uint)(fVar80 * 2.5 + auVar67._0_4_));
  auVar67 = vroundss_avx(auVar67,auVar67,0xb);
  auVar68 = vpternlogd_avx512vl(auVar102,ZEXT416((uint)(fVar80 * 3.5)),auVar101,0xf8);
  auVar68 = ZEXT416((uint)(fVar80 * 3.5 + auVar68._0_4_));
  auVar68 = vroundss_avx(auVar68,auVar68,0xb);
  auVar69 = vpternlogd_avx512vl(auVar102,ZEXT416((uint)(fVar80 * 4.5)),auVar101,0xf8);
  auVar69 = ZEXT416((uint)(fVar80 * 4.5 + auVar69._0_4_));
  auVar69 = vroundss_avx(auVar69,auVar69,0xb);
  auVar70 = vpternlogd_avx512vl(auVar102,ZEXT416((uint)(fVar80 * 5.5)),auVar101,0xf8);
  auVar70 = ZEXT416((uint)(fVar80 * 5.5 + auVar70._0_4_));
  auVar70 = vroundss_avx(auVar70,auVar70,0xb);
  auVar71 = vpternlogd_avx512vl(auVar102,ZEXT416((uint)(fVar80 * 6.5)),auVar101,0xf8);
  auVar71 = ZEXT416((uint)(fVar80 * 6.5 + auVar71._0_4_));
  auVar71 = vroundss_avx(auVar71,auVar71,0xb);
  auVar72 = vpternlogd_avx512vl(auVar102,ZEXT416((uint)(fVar80 * 7.5)),auVar101,0xf8);
  auVar72 = ZEXT416((uint)(auVar72._0_4_ + fVar80 * 7.5));
  auVar72 = vroundss_avx(auVar72,auVar72,0xb);
  auVar73 = vpternlogd_avx512vl(auVar102,ZEXT416((uint)(fVar80 * 8.5)),auVar101,0xf8);
  auVar73 = ZEXT416((uint)(fVar80 * 8.5 + auVar73._0_4_));
  auVar73 = vroundss_avx(auVar73,auVar73,0xb);
  auVar74 = vpternlogd_avx512vl(auVar102,ZEXT416((uint)(fVar80 * 9.5)),auVar101,0xf8);
  auVar74 = ZEXT416((uint)(fVar80 * 9.5 + auVar74._0_4_));
  auVar74 = vroundss_avx(auVar74,auVar74,0xb);
  auVar75 = vpternlogd_avx512vl(auVar102,ZEXT416((uint)(fVar80 * 10.5)),auVar101,0xf8);
  auVar75 = ZEXT416((uint)(fVar80 * 10.5 + auVar75._0_4_));
  auVar75 = vroundss_avx(auVar75,auVar75,0xb);
  auVar76 = vpternlogd_avx512vl(auVar102,ZEXT416((uint)(fVar80 * 11.5)),auVar101,0xf8);
  auVar76 = ZEXT416((uint)(fVar80 * 11.5 + auVar76._0_4_));
  auVar76 = vroundss_avx(auVar76,auVar76,0xb);
  fVar85 = auVar67._0_4_;
  fVar80 = fVar85 + auVar66._0_4_;
  fVar7 = fVar85 + auVar65._0_4_;
  fVar8 = fVar85 - auVar65._0_4_;
  fVar79 = fVar85 - auVar66._0_4_;
  fVar96 = fVar85 - auVar68._0_4_;
  fVar9 = fVar85 - auVar69._0_4_;
  fVar10 = fVar85 - auVar70._0_4_;
  fVar85 = fVar85 - auVar71._0_4_;
  fVar100 = auVar72._0_4_;
  fVar11 = fVar100 - auVar68._0_4_;
  fVar12 = fVar100 - auVar69._0_4_;
  fVar13 = fVar100 - auVar70._0_4_;
  fVar14 = fVar100 - auVar71._0_4_;
  fVar15 = fVar100 - auVar73._0_4_;
  fVar16 = fVar100 - auVar74._0_4_;
  fVar17 = fVar100 - auVar75._0_4_;
  fVar100 = fVar100 - auVar76._0_4_;
  gauss_s1_c0[0] = expf(fVar80 * fVar80 * fVar78);
  gauss_s1_c0[1] = expf(fVar7 * fVar7 * fVar78);
  gauss_s1_c0[2] = expf(fVar8 * fVar8 * fVar78);
  gauss_s1_c0[3] = expf(fVar79 * fVar79 * fVar78);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar96 * fVar96 * fVar78);
  gauss_s1_c0[6] = expf(fVar9 * fVar9 * fVar78);
  gauss_s1_c0[7] = expf(fVar10 * fVar10 * fVar78);
  gauss_s1_c0[8] = expf(fVar85 * fVar85 * fVar78);
  gauss_s1_c1[0] = expf(fVar11 * fVar11 * fVar78);
  gauss_s1_c1[1] = expf(fVar12 * fVar12 * fVar78);
  gauss_s1_c1[2] = expf(fVar13 * fVar13 * fVar78);
  gauss_s1_c1[3] = expf(fVar14 * fVar14 * fVar78);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar15 * fVar15 * fVar78);
  gauss_s1_c1[6] = expf(fVar16 * fVar16 * fVar78);
  gauss_s1_c1[7] = expf(fVar17 * fVar17 * fVar78);
  gauss_s1_c1[8] = expf(fVar100 * fVar100 * fVar78);
  uVar28 = 0xfffffff8;
  lVar43 = 0;
  fVar80 = 0.0;
  auVar84._8_4_ = 0x7fffffff;
  auVar84._0_8_ = 0x7fffffff7fffffff;
  auVar84._12_4_ = 0x7fffffff;
  lVar42 = 0;
  lVar54 = 0;
  do {
    pfVar52 = gauss_s1_c1;
    uVar27 = (uint)uVar28;
    if (uVar27 != 7) {
      pfVar52 = gauss_s1_c0;
    }
    if (uVar27 == 0xfffffff8) {
      pfVar52 = gauss_s1_c1;
    }
    lVar42 = (long)(int)lVar42;
    iVar57 = (int)lVar54;
    lVar54 = (long)iVar57;
    lVar51 = (long)haarResponseX + lVar43;
    lVar44 = (long)haarResponseY + lVar43;
    uVar49 = 0xfffffff8;
    uVar45 = 0;
    do {
      pfVar53 = gauss_s1_c1;
      if (uVar49 != 7) {
        pfVar53 = gauss_s1_c0;
      }
      if (uVar49 == 0xfffffff8) {
        pfVar53 = gauss_s1_c1;
      }
      uVar64 = (ulong)(uVar49 >> 0x1c & 0xfffffff8);
      auVar98 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar41 = uVar45;
      lVar59 = lVar51;
      lVar62 = lVar44;
      do {
        lVar55 = 0;
        pfVar50 = (float *)((long)pfVar52 + (ulong)(uint)((int)(uVar28 >> 0x1f) << 5));
        do {
          fVar7 = pfVar53[uVar64] * *pfVar50;
          auVar65 = vinsertps_avx(ZEXT416(*(uint *)(lVar62 + lVar55 * 4)),
                                  ZEXT416(*(uint *)(lVar59 + lVar55 * 4)),0x10);
          auVar95._0_4_ = fVar7 * auVar65._0_4_;
          auVar95._4_4_ = fVar7 * auVar65._4_4_;
          auVar95._8_4_ = fVar7 * auVar65._8_4_;
          auVar95._12_4_ = fVar7 * auVar65._12_4_;
          auVar65 = vandps_avx(auVar95,auVar84);
          auVar65 = vmovlhps_avx(auVar95,auVar65);
          auVar86._0_4_ = auVar98._0_4_ + auVar65._0_4_;
          auVar86._4_4_ = auVar98._4_4_ + auVar65._4_4_;
          auVar86._8_4_ = auVar98._8_4_ + auVar65._8_4_;
          auVar86._12_4_ = auVar98._12_4_ + auVar65._12_4_;
          auVar98 = ZEXT1664(auVar86);
          pfVar50 = pfVar50 + (ulong)(~uVar27 >> 0x1f) * 2 + -1;
          lVar55 = lVar55 + 1;
        } while (lVar55 != 9);
        uVar41 = uVar41 + 0x18;
        uVar64 = uVar64 + (ulong)(-1 < (int)uVar49) * 2 + -1;
        lVar59 = lVar59 + 0x60;
        lVar62 = lVar62 + 0x60;
      } while (uVar41 < uVar49 * 0x18 + 0x198);
      fVar7 = gauss_s2_arr[lVar54];
      auVar21._4_4_ = fVar7;
      auVar21._0_4_ = fVar7;
      auVar21._8_4_ = fVar7;
      auVar21._12_4_ = fVar7;
      auVar67 = vmulps_avx512vl(auVar86,auVar21);
      lVar54 = lVar54 + 1;
      *(undefined1 (*) [16])(ipoint->descriptor + lVar42) = auVar67;
      auVar87._0_4_ = auVar67._0_4_ * auVar67._0_4_;
      auVar87._4_4_ = auVar67._4_4_ * auVar67._4_4_;
      auVar87._8_4_ = auVar67._8_4_ * auVar67._8_4_;
      auVar87._12_4_ = auVar67._12_4_ * auVar67._12_4_;
      auVar65 = vmovshdup_avx(auVar87);
      auVar66 = vfmadd231ss_fma(auVar65,auVar67,auVar67);
      auVar65 = vshufpd_avx(auVar67,auVar67,1);
      auVar66 = vfmadd213ss_fma(auVar65,auVar65,auVar66);
      auVar65 = vshufps_avx(auVar67,auVar67,0xff);
      auVar65 = vfmadd213ss_fma(auVar65,auVar65,auVar66);
      fVar80 = fVar80 + auVar65._0_4_;
      lVar42 = lVar42 + 4;
      uVar49 = uVar49 + 5;
      uVar45 = uVar45 + 0x78;
      lVar51 = lVar51 + 0x1e0;
      lVar44 = lVar44 + 0x1e0;
    } while (iVar57 + 4 != (int)lVar54);
    lVar43 = lVar43 + 0x14;
    uVar28 = (ulong)(uVar27 + 5);
  } while ((int)uVar27 < 3);
  if (fVar80 < 0.0) {
    fVar80 = sqrtf(fVar80);
  }
  else {
    auVar65 = vsqrtss_avx(ZEXT416((uint)fVar80),ZEXT416((uint)fVar80));
    fVar80 = auVar65._0_4_;
  }
  auVar98 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar80)));
  lVar43 = 0;
  do {
    auVar103 = vmulps_avx512f(auVar98,*(undefined1 (*) [64])(ipoint->descriptor + lVar43));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar43) = auVar103;
    lVar43 = lVar43 + 0x10;
  } while (lVar43 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_4_3_False(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=4, l_count+=4) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l3 = l + 3;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            int l_count3 = l_count + 3;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            float ipoint_y_sub_int_scale_add_l2_mul_scale = ipoint_y_sub_int_scale + l2 * scale;
            float ipoint_y_sub_int_scale_add_l3_mul_scale = ipoint_y_sub_int_scale + l3 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_l2_mul_scale + (ipoint_y_sub_int_scale_add_l2_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale3 = (int) (ipoint_y_sub_int_scale_add_l3_mul_scale + (ipoint_y_sub_int_scale_add_l3_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=3, k_count+=3) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count2*24+k_count1], &haarResponseY[l_count2*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count2*24+k_count2], &haarResponseY[l_count2*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count3*24+k_count0], &haarResponseY[l_count3*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count3*24+k_count1], &haarResponseY[l_count3*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count3*24+k_count2], &haarResponseY[l_count3*24+k_count2]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=4, l_count+=4) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l3 = l + 3;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            int l_count3 = l_count + 3;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_05 + l2 * scale);
            int sample_y_sub_int_scale3 = (int) (ipoint_y_sub_int_scale_add_05 + l3 * scale);

            for (int k=-12, k_count=0; k<12; k+=3, k_count+=3) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count2*24+k_count1], &haarResponseY[l_count2*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count2*24+k_count2], &haarResponseY[l_count2*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count3*24+k_count0], &haarResponseY[l_count3*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count3*24+k_count1], &haarResponseY[l_count3*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count3*24+k_count2], &haarResponseY[l_count3*24+k_count2]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}